

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

void * hugeOpen(char *URI)

{
  int iVar1;
  size_t sVar2;
  char *URI_local;
  
  if ((URI != (char *)0x0) && (iVar1 = strncmp(URI,"huge:",5), iVar1 == 0)) {
    currentTest = 0;
    while( true ) {
      if (3 < currentTest) {
        return (void *)0x0;
      }
      iVar1 = strcmp(hugeTests[currentTest].name,URI);
      if (iVar1 == 0) break;
      currentTest = currentTest + 1;
    }
    sVar2 = strlen(hugeTests[currentTest].start);
    rlen = (int)sVar2;
    current = hugeTests[currentTest].start;
    instate = 0;
    return hugeTests[currentTest].start;
  }
  return (void *)0x0;
}

Assistant:

static void *
hugeOpen(const char * URI) {
    if ((URI == NULL) || (strncmp(URI, "huge:", 5)))
        return(NULL);

    for (currentTest = 0;currentTest < sizeof(hugeTests)/sizeof(hugeTests[0]);
         currentTest++)
         if (!strcmp(hugeTests[currentTest].name, URI))
             goto found;

    return(NULL);

found:
    rlen = strlen(hugeTests[currentTest].start);
    current = hugeTests[currentTest].start;
    instate = 0;
    return((void *) current);
}